

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::RelayTransaction
          (PeerManagerImpl *this,uint256 *txid,uint256 *wtxid)

{
  Peer *this_00;
  bool bVar1;
  TxRelay *pTVar2;
  _Base_ptr p_Var3;
  uint256 *__v;
  _Rb_tree_header *p_Var4;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock48;
  unique_lock<std::recursive_mutex> local_58;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->m_peer_mutex).super_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  p_Var3 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      this_00 = (Peer *)p_Var3[1]._M_parent;
      pTVar2 = Peer::GetTxRelay(this_00);
      if (pTVar2 != (TxRelay *)0x0) {
        local_58._M_device = &(pTVar2->m_tx_inventory_mutex).super_recursive_mutex;
        local_58._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&local_58);
        if ((pTVar2->m_next_inv_send_time).__r != 0) {
          __v = txid;
          if (((this_00->m_wtxid_relay)._M_base._M_i & 1U) != 0) {
            __v = wtxid;
          }
          vKey.m_size = 0x20;
          vKey.m_data = (uchar *)__v;
          bVar1 = CRollingBloomFilter::contains(&pTVar2->m_tx_inventory_known_filter,vKey);
          if (!bVar1) {
            std::
            _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
            ::_M_insert_unique<uint256_const&>
                      ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                        *)&pTVar2->m_tx_inventory_to_send,__v);
          }
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::RelayTransaction(const uint256& txid, const uint256& wtxid)
{
    LOCK(m_peer_mutex);
    for(auto& it : m_peer_map) {
        Peer& peer = *it.second;
        auto tx_relay = peer.GetTxRelay();
        if (!tx_relay) continue;

        LOCK(tx_relay->m_tx_inventory_mutex);
        // Only queue transactions for announcement once the version handshake
        // is completed. The time of arrival for these transactions is
        // otherwise at risk of leaking to a spy, if the spy is able to
        // distinguish transactions received during the handshake from the rest
        // in the announcement.
        if (tx_relay->m_next_inv_send_time == 0s) continue;

        const uint256& hash{peer.m_wtxid_relay ? wtxid : txid};
        if (!tx_relay->m_tx_inventory_known_filter.contains(hash)) {
            tx_relay->m_tx_inventory_to_send.insert(hash);
        }
    };
}